

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDocument.cpp
# Opt level: O3

BOOL __thiscall
Js::DebugDocument::GetStatementSpan(DebugDocument *this,int32 ibos,StatementSpan *pStatement)

{
  BOOL BVar1;
  undefined1 local_28 [8];
  StatementLocation statement;
  
  statement.function = (FunctionBody *)0x0;
  statement.statement.begin = 0;
  statement.statement.end = 0;
  BVar1 = GetStatementLocation(this,ibos,(StatementLocation *)local_28);
  if (BVar1 != 0) {
    pStatement->ich = (int)statement.function;
    pStatement->cch = statement.function._4_4_ - (int)statement.function;
  }
  return (uint)(BVar1 != 0);
}

Assistant:

BOOL DebugDocument::GetStatementSpan(int32 ibos, StatementSpan* pStatement)
    {
        StatementLocation statement;
        if (GetStatementLocation(ibos, &statement))
        {
            pStatement->ich = statement.statement.begin;
            pStatement->cch = statement.statement.end - statement.statement.begin;
            return TRUE;
        }
        return FALSE;
    }